

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void fmt::v10::detail::
     handle_dynamic_spec<fmt::v10::detail::precision_checker,fmt::v10::basic_format_context<fmt::v10::appender,char>>
               (int *value,arg_ref<char> ref,basic_format_context<fmt::v10::appender,_char> *ctx)

{
  int iVar1;
  size_t in_R8;
  basic_string_view<char> id;
  format_arg local_58;
  format_arg local_38;
  
  if (ref.kind == name) {
    id.size_ = in_R8;
    id.data_ = (char *)ref.val.name.size_;
    get_arg<fmt::v10::basic_format_context<fmt::v10::appender,char>,fmt::v10::basic_string_view<char>>
              (&local_58,(detail *)ctx,ref.val._0_8_,id);
  }
  else {
    if (ref.kind != index) {
      return;
    }
    get_arg<fmt::v10::basic_format_context<fmt::v10::appender,char>,int>
              (&local_38,(detail *)ctx,
               (basic_format_context<fmt::v10::appender,_char> *)(ulong)(uint)ref.val.index,1);
  }
  iVar1 = get_dynamic_spec<fmt::v10::detail::precision_checker,fmt::v10::basic_format_arg<fmt::v10::basic_format_context<fmt::v10::appender,char>>,fmt::v10::detail::error_handler>
                    ();
  *value = iVar1;
  return;
}

Assistant:

FMT_CONSTEXPR void handle_dynamic_spec(int& value,
                                       arg_ref<typename Context::char_type> ref,
                                       Context& ctx) {
  switch (ref.kind) {
  case arg_id_kind::none:
    break;
  case arg_id_kind::index:
    value = detail::get_dynamic_spec<Handler>(get_arg(ctx, ref.val.index),
                                              ctx.error_handler());
    break;
  case arg_id_kind::name:
    value = detail::get_dynamic_spec<Handler>(get_arg(ctx, ref.val.name),
                                              ctx.error_handler());
    break;
  }
}